

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.cpp
# Opt level: O0

int Am_Right_Is_Right_Of_Owner_proc(Am_Object *self)

{
  int iVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Wrapper *pAVar4;
  int right_offset;
  int owner_width;
  Am_Object local_28;
  Am_Object owner;
  int my_width;
  Am_Object *self_local;
  
  pAVar3 = Am_Object::Get(self,0x66,0);
  owner.data._4_4_ = Am_Value::operator_cast_to_int(pAVar3);
  Am_Object::Get_Owner(&local_28,(Am_Slot_Flags)self);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_28);
  if (pAVar4 == (Am_Wrapper *)0x0) {
    self_local._4_4_ = 0;
  }
  else {
    pAVar3 = Am_Object::Get(&local_28,0x66,0);
    iVar1 = Am_Value::operator_cast_to_int(pAVar3);
    pAVar3 = Am_Object::Get(&local_28,0xa0,0);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    self_local._4_4_ = (iVar1 - owner.data._4_4_) - iVar2;
  }
  Am_Object::~Am_Object(&local_28);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, Am_Right_Is_Right_Of_Owner)
{
  int my_width = self.Get(Am_WIDTH);
  Am_Object owner = self.Get_Owner();
  if (owner) {
    int owner_width = owner.Get(Am_WIDTH);
    int right_offset = owner.Get(Am_RIGHT_OFFSET);
    return owner_width - my_width - right_offset;
  } else {
    return 0;
  }
}